

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O0

CURLcode gopher_do(Curl_easy *data,_Bool *done)

{
  int iVar1;
  size_t sVar2;
  char *newp;
  size_t sStack_80;
  int what;
  size_t len;
  size_t amount;
  ssize_t k;
  timediff_t timeout_ms;
  char *sel_org;
  char *sel;
  char *query;
  char *path;
  char *gopherpath;
  connectdata *pcStack_30;
  curl_socket_t sockfd;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  pcStack_30 = data->conn;
  gopherpath._4_4_ = pcStack_30->sock[0];
  query = (data->state).up.path;
  sel = (data->state).up.query;
  sel_org = (char *)0x0;
  timeout_ms = 0;
  *done = true;
  p_Stack_20 = done;
  done_local = (_Bool *)data;
  if (sel == (char *)0x0) {
    path = (*Curl_cstrdup)(query);
  }
  else {
    path = curl_maprintf("%s?%s",query,sel);
  }
  if (path == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar2 = strlen(path);
    if (sVar2 < 3) {
      sel_org = "";
      sStack_80 = strlen("");
      (*Curl_cfree)(path);
    }
    else {
      conn._4_4_ = Curl_urldecode(path + 2,0,&sel_org,&stack0xffffffffffffff80,REJECT_ZERO);
      (*Curl_cfree)(path);
      if (conn._4_4_ != CURLE_OK) {
        return conn._4_4_;
      }
      timeout_ms = (timediff_t)sel_org;
    }
    amount = curlx_uztosz(sStack_80);
    do {
      sVar2 = strlen(sel_org);
      if (((sVar2 == 0) ||
          (conn._4_4_ = Curl_xfer_send((Curl_easy *)done_local,sel_org,amount,false,&len),
          conn._4_4_ != CURLE_OK)) ||
         (conn._4_4_ = Curl_client_write((Curl_easy *)done_local,4,sel_org,len),
         conn._4_4_ != CURLE_OK)) goto LAB_00148224;
      amount = amount - len;
      sel_org = sel_org + len;
      if ((long)amount < 1) goto LAB_00148224;
      k = Curl_timeleft((Curl_easy *)done_local,(curltime *)0x0,false);
      if (k < 0) {
        conn._4_4_ = CURLE_OPERATION_TIMEDOUT;
        goto LAB_00148224;
      }
      if (k == 0) {
        k = 0x7fffffffffffffff;
      }
      iVar1 = Curl_socket_check(-1,-1,gopherpath._4_4_,k);
      if (iVar1 < 0) {
        conn._4_4_ = CURLE_SEND_ERROR;
        goto LAB_00148224;
      }
    } while (iVar1 != 0);
    conn._4_4_ = CURLE_OPERATION_TIMEDOUT;
LAB_00148224:
    (*Curl_cfree)((void *)timeout_ms);
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = Curl_xfer_send((Curl_easy *)done_local,"\r\n",2,false,&len);
    }
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = Curl_client_write((Curl_easy *)done_local,4,"\r\n",2);
      data_local._4_4_ = conn._4_4_;
      if (conn._4_4_ == CURLE_OK) {
        Curl_xfer_setup1((Curl_easy *)done_local,1,-1,false);
        data_local._4_4_ = CURLE_OK;
      }
    }
    else {
      Curl_failf((Curl_easy *)done_local,"Failed sending Gopher request");
      data_local._4_4_ = conn._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode gopher_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  char *gopherpath;
  char *path = data->state.up.path;
  char *query = data->state.up.query;
  char *sel = NULL;
  char *sel_org = NULL;
  timediff_t timeout_ms;
  ssize_t k;
  size_t amount, len;
  int what;

  *done = TRUE; /* unconditionally */

  /* path is guaranteed non-NULL */
  DEBUGASSERT(path);

  if(query)
    gopherpath = aprintf("%s?%s", path, query);
  else
    gopherpath = strdup(path);

  if(!gopherpath)
    return CURLE_OUT_OF_MEMORY;

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(gopherpath) <= 2) {
    sel = (char *)CURL_UNCONST("");
    len = strlen(sel);
    free(gopherpath);
  }
  else {
    char *newp;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = gopherpath;
    newp += 2;

    /* ... and finally unescape */
    result = Curl_urldecode(newp, 0, &sel, &len, REJECT_ZERO);
    free(gopherpath);
    if(result)
      return result;
    sel_org = sel;
  }

  k = curlx_uztosz(len);

  for(;;) {
    /* Break out of the loop if the selector is empty because OpenSSL and/or
       LibreSSL fail with errno 0 if this is the case. */
    if(strlen(sel) < 1)
      break;

    result = Curl_xfer_send(data, sel, k, FALSE, &amount);
    if(!result) { /* Which may not have written it all! */
      result = Curl_client_write(data, CLIENTWRITE_HEADER, sel, amount);
      if(result)
        break;

      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else
      break;

    timeout_ms = Curl_timeleft(data, NULL, FALSE);
    if(timeout_ms < 0) {
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    }
    if(!timeout_ms)
      timeout_ms = TIMEDIFF_T_MAX;

    /* Do not busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that are not
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.
    */
    what = SOCKET_WRITABLE(sockfd, timeout_ms);
    if(what < 0) {
      result = CURLE_SEND_ERROR;
      break;
    }
    else if(!what) {
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    }
  }

  free(sel_org);

  if(!result)
    result = Curl_xfer_send(data, "\r\n", 2, FALSE, &amount);
  if(result) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(data, CLIENTWRITE_HEADER, "\r\n", 2);
  if(result)
    return result;

  Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);
  return CURLE_OK;
}